

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void mbedtls_ssl_flight_free(mbedtls_ssl_flight_item *flight)

{
  mbedtls_ssl_flight_item *pmVar1;
  mbedtls_ssl_flight_item *next;
  mbedtls_ssl_flight_item *cur;
  mbedtls_ssl_flight_item *flight_local;
  
  next = flight;
  while (next != (mbedtls_ssl_flight_item *)0x0) {
    pmVar1 = next->next;
    free(next->p);
    free(next);
    next = pmVar1;
  }
  return;
}

Assistant:

void mbedtls_ssl_flight_free(mbedtls_ssl_flight_item *flight)
{
    mbedtls_ssl_flight_item *cur = flight;
    mbedtls_ssl_flight_item *next;

    while (cur != NULL) {
        next = cur->next;

        mbedtls_free(cur->p);
        mbedtls_free(cur);

        cur = next;
    }
}